

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O3

void __thiscall QuadList<SSTableDataEntry>::clear(QuadList<SSTableDataEntry> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  QuadListNode<SSTableDataEntry> *pQVar3;
  QuadListNode<SSTableDataEntry> *pQVar4;
  
  pQVar4 = this->header->succ;
  if (pQVar4 != this->trailer) {
    do {
      pcVar2 = (pQVar4->data).value._M_dataplus._M_p;
      pQVar3 = pQVar4->succ;
      paVar1 = &(pQVar4->data).value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pQVar4,0x60);
      pQVar4 = pQVar3;
    } while (pQVar3 != this->trailer);
  }
  return;
}

Assistant:

void QuadList<T>::clear() {
    auto *current = header->succ;
    while (current != trailer) {
        auto *next = current->succ;
        delete current;
        current = next;
    }
}